

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::CopyCommandsToByteArray
               (Command *cmds,size_t num_commands,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *insert_and_copy_codes,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *distance_prefixes)

{
  Command *cmd;
  size_t i;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *distance_prefixes_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *insert_and_copy_codes_local;
  size_t num_commands_local;
  Command *cmds_local;
  
  for (cmd = (Command *)0x0; cmd < num_commands; cmd = (Command *)((long)&cmd->insert_len_ + 1)) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (insert_and_copy_codes,&cmds[(long)cmd].cmd_prefix_);
    if ((cmds[(long)cmd].copy_len_ != 0) && (0x7f < cmds[(long)cmd].cmd_prefix_)) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (distance_prefixes,&cmds[(long)cmd].dist_prefix_);
    }
  }
  return;
}

Assistant:

void CopyCommandsToByteArray(const Command* cmds,
                             const size_t num_commands,
                             std::vector<uint16_t>* insert_and_copy_codes,
                             std::vector<uint16_t>* distance_prefixes) {
  for (size_t i = 0; i < num_commands; ++i) {
    const Command& cmd = cmds[i];
    insert_and_copy_codes->push_back(cmd.cmd_prefix_);
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      distance_prefixes->push_back(cmd.dist_prefix_);
    }
  }
}